

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::ComputeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int quantization_bits)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  reference pvVar8;
  type pfVar9;
  int in_EDX;
  PointAttribute *in_RSI;
  long in_RDI;
  float fVar10;
  float dif;
  int c_1;
  int c;
  AttributeValueIndex i;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  unique_ptr<float[],_std::default_delete<float[]>_> max_values;
  int num_components;
  float *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  allocator_type *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  GeometryAttribute *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  AttributeValueIndex in_stack_fffffffffffffeb4;
  int local_80;
  int local_7c;
  uint local_74;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_70;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_6c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_68;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_64 [10];
  undefined4 local_3c;
  uint local_20;
  int local_1c;
  PointAttribute *local_18;
  byte local_1;
  
  if (*(int *)(in_RDI + 8) == -1) {
    local_1c = in_EDX;
    local_18 = in_RSI;
    bVar3 = IsQuantizationValid(in_EDX);
    if (bVar3) {
      *(int *)(in_RDI + 8) = local_1c;
      bVar4 = GeometryAttribute::num_components(&local_18->super_GeometryAttribute);
      local_20 = (uint)bVar4;
      *(undefined4 *)(in_RDI + 0x28) = 0;
      local_3c = 0;
      std::allocator<float>::allocator((allocator<float> *)0x20df08);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4.value_,in_stack_fffffffffffffeb0),
                 (size_type)in_stack_fffffffffffffea8,
                 (value_type_conflict2 *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe98);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      std::allocator<float>::~allocator((allocator<float> *)0x20df6a);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)local_20;
      uVar6 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::
      unique_ptr<float*,std::default_delete<float[]>,void,bool>
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)local_20;
      uVar6 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      operator_new__(uVar6);
      std::unique_ptr<float[],std::default_delete<float[]>>::
      unique_ptr<float*,std::default_delete<float[]>,void,bool>
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_64,0);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      GeometryAttribute::GetValue
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4,
                 (void *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_68,0);
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x20e06c);
      GeometryAttribute::GetValue
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4,
                 (void *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_6c,0);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      GeometryAttribute::GetValue
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4,
                 (void *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_70,1);
      while( true ) {
        sVar7 = PointAttribute::size(local_18);
        local_74 = (uint)sVar7;
        bVar3 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                          (&local_70,&local_74);
        if (!bVar3) break;
        std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                  ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        GeometryAttribute::GetValue
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4,
                   (void *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
        for (local_7c = 0; local_7c < (int)local_20; local_7c = local_7c + 1) {
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),
                              (long)local_7c);
          fVar10 = *pvVar8;
          pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                             ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (size_t)in_stack_fffffffffffffe88);
          if (*pfVar9 <= fVar10 && fVar10 != *pfVar9) {
            pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                               ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (size_t)in_stack_fffffffffffffe88);
            fVar10 = *pfVar9;
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),
                                (long)local_7c);
            *pvVar8 = fVar10;
          }
          pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                             ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (size_t)in_stack_fffffffffffffe88);
          fVar10 = *pfVar9;
          pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                             ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (size_t)in_stack_fffffffffffffe88);
          if (fVar10 < *pfVar9) {
            pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                               ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (size_t)in_stack_fffffffffffffe88);
            fVar10 = *pfVar9;
            pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                               ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (size_t)in_stack_fffffffffffffe88);
            *pfVar9 = fVar10;
          }
        }
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(&local_70);
      }
      for (local_80 = 0; local_80 < (int)local_20; local_80 = local_80 + 1) {
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),(long)local_80)
        ;
        uVar5 = std::isnan((double)(ulong)(uint)*pvVar8);
        if ((uVar5 & 1) != 0) {
LAB_0020e481:
          local_1 = 0;
          goto LAB_0020e577;
        }
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),(long)local_80)
        ;
        uVar5 = std::isinf((double)(ulong)(uint)*pvVar8);
        if ((uVar5 & 1) != 0) goto LAB_0020e481;
        pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (size_t)in_stack_fffffffffffffe88);
        uVar5 = std::isnan((double)(ulong)(uint)*pfVar9);
        if ((uVar5 & 1) != 0) goto LAB_0020e481;
        pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (size_t)in_stack_fffffffffffffe88);
        uVar5 = std::isinf((double)(ulong)(uint)*pfVar9);
        if ((uVar5 & 1) != 0) goto LAB_0020e481;
        pfVar9 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (size_t)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffe94 = *pfVar9;
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x10),(long)local_80)
        ;
        fVar10 = in_stack_fffffffffffffe94 - *pvVar8;
        if (*(float *)(in_RDI + 0x28) <= fVar10 && fVar10 != *(float *)(in_RDI + 0x28)) {
          *(float *)(in_RDI + 0x28) = fVar10;
        }
      }
      if ((*(float *)(in_RDI + 0x28) == 0.0) && (!NAN(*(float *)(in_RDI + 0x28)))) {
        *(undefined4 *)(in_RDI + 0x28) = 0x3f800000;
      }
      local_1 = 1;
LAB_0020e577:
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AttributeQuantizationTransform::ComputeParameters(
    const PointAttribute &attribute, const int quantization_bits) {
  if (quantization_bits_ != -1) {
    return false;  // already initialized.
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;

  const int num_components = attribute.num_components();
  range_ = 0.f;
  min_values_ = std::vector<float>(num_components, 0.f);
  const std::unique_ptr<float[]> max_values(new float[num_components]);
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  // Compute minimum values and max value difference.
  attribute.GetValue(AttributeValueIndex(0), att_val.get());
  attribute.GetValue(AttributeValueIndex(0), min_values_.data());
  attribute.GetValue(AttributeValueIndex(0), max_values.get());

  for (AttributeValueIndex i(1); i < static_cast<uint32_t>(attribute.size());
       ++i) {
    attribute.GetValue(i, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      if (min_values_[c] > att_val[c]) {
        min_values_[c] = att_val[c];
      }
      if (max_values[c] < att_val[c]) {
        max_values[c] = att_val[c];
      }
    }
  }
  for (int c = 0; c < num_components; ++c) {
    if (std::isnan(min_values_[c]) || std::isinf(min_values_[c]) ||
        std::isnan(max_values[c]) || std::isinf(max_values[c])) {
      return false;
    }
    const float dif = max_values[c] - min_values_[c];
    if (dif > range_) {
      range_ = dif;
    }
  }

  // In case all values are the same, initialize the range to unit length. This
  // will ensure that all values are quantized properly to the same value.
  if (range_ == 0.f) {
    range_ = 1.f;
  }

  return true;
}